

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

void string_process_escapes(string *input)

{
  ulong uVar1;
  char cVar2;
  ulong uVar3;
  long lVar4;
  pointer pcVar5;
  ulong uVar6;
  long lVar7;
  char x [3];
  char *err_p;
  
  uVar3 = input->_M_string_length;
  uVar6 = 0;
  lVar7 = 0;
  do {
    if (uVar3 <= uVar6) {
      std::__cxx11::string::resize((ulong)input);
      return;
    }
    pcVar5 = (input->_M_dataplus)._M_p;
    if ((pcVar5[uVar6] == '\\') && (uVar1 = uVar6 + 1, uVar1 < uVar3)) {
      cVar2 = pcVar5[uVar1];
      if (cVar2 == '\"') {
        pcVar5[lVar7] = '\"';
      }
      else if (cVar2 == '\'') {
        pcVar5[lVar7] = '\'';
      }
      else if (cVar2 == '\\') {
        pcVar5[lVar7] = '\\';
      }
      else {
        if (cVar2 == 'x') {
          if (uVar6 + 3 < uVar3) {
            x[0] = pcVar5[uVar6 + 2];
            x[1] = pcVar5[uVar6 + 3];
            x[2] = '\0';
            err_p = (char *)0x0;
            lVar4 = strtol(x,&err_p,0x10);
            if (err_p == x + 2) {
              (input->_M_dataplus)._M_p[lVar7] = (char)lVar4;
              lVar7 = lVar7 + 1;
              uVar6 = uVar6 + 3;
              goto LAB_001215f4;
            }
            pcVar5 = (input->_M_dataplus)._M_p;
          }
LAB_0012163e:
          pcVar5[lVar7] = '\\';
          pcVar5 = (input->_M_dataplus)._M_p;
          pcVar5[lVar7 + 1] = pcVar5[uVar1];
          lVar7 = lVar7 + 2;
          uVar6 = uVar1;
          goto LAB_001215f4;
        }
        if (cVar2 == 'r') {
          pcVar5[lVar7] = '\r';
        }
        else if (cVar2 == 't') {
          pcVar5[lVar7] = '\t';
        }
        else {
          if (cVar2 != 'n') goto LAB_0012163e;
          pcVar5[lVar7] = '\n';
        }
      }
      lVar7 = lVar7 + 1;
      uVar6 = uVar1;
    }
    else {
      pcVar5[lVar7] = pcVar5[uVar6];
      lVar7 = lVar7 + 1;
    }
LAB_001215f4:
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void string_process_escapes(std::string & input) {
    std::size_t input_len = input.length();
    std::size_t output_idx = 0;

    for (std::size_t input_idx = 0; input_idx < input_len; ++input_idx) {
        if (input[input_idx] == '\\' && input_idx + 1 < input_len) {
            switch (input[++input_idx]) {
                case 'n':  input[output_idx++] = '\n'; break;
                case 'r':  input[output_idx++] = '\r'; break;
                case 't':  input[output_idx++] = '\t'; break;
                case '\'': input[output_idx++] = '\''; break;
                case '\"': input[output_idx++] = '\"'; break;
                case '\\': input[output_idx++] = '\\'; break;
                case 'x':
                    // Handle \x12, etc
                    if (input_idx + 2 < input_len) {
                        const char x[3] = { input[input_idx + 1], input[input_idx + 2], 0 };
                        char *err_p = nullptr;
                        const long val = std::strtol(x, &err_p, 16);
                        if (err_p == x + 2) {
                            input_idx += 2;
                            input[output_idx++] = char(val);
                            break;
                        }
                    }
                    // fall through
                default:   input[output_idx++] = '\\';
                           input[output_idx++] = input[input_idx]; break;
            }
        } else {
            input[output_idx++] = input[input_idx];
        }
    }

    input.resize(output_idx);
}